

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O1

int beMsgGetListBdIds(be_node *n,list<bdId,_std::allocator<bdId>_> *nodes)

{
  size_t *psVar1;
  char *pcVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bdId id;
  undefined1 local_58 [24];
  _List_node_base *p_Stack_40;
  uchar local_38 [8];
  
  iVar5 = 0;
  if (n->type == BE_STR) {
    uVar3 = be_str_len(n);
    if (0x19 < (int)uVar3) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        bdId::bdId((bdId *)local_58);
        pcVar2 = (n->val).s;
        lVar7 = 0x10;
        do {
          local_58[lVar7] = pcVar2[lVar7 + lVar8 + -0x10];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x24);
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58._4_4_ = *(undefined4 *)(pcVar2 + uVar6 * 0x1a + 0x14);
        local_58._2_2_ = *(undefined2 *)(pcVar2 + uVar6 * 0x1a + 0x18);
        local_58._0_2_ = 2;
        p_Var4 = (_List_node_base *)operator_new(0x38);
        p_Var4[1]._M_next = (_List_node_base *)local_58._0_8_;
        p_Var4[1]._M_prev = (_List_node_base *)local_58._8_8_;
        p_Var4[2]._M_next = (_List_node_base *)local_58._16_8_;
        p_Var4[2]._M_prev = p_Stack_40;
        *(undefined4 *)&p_Var4[3]._M_next = local_38._0_4_;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(nodes->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x1a;
      } while (uVar6 != (uVar3 & 0xffffffff) / 0x1a);
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int beMsgGetListBdIds(be_node *n, std::list<bdId> &nodes) {
	/* extract the string pointer, and size */
	/* split into parts */

        if (n->type != BE_STR)
            return 0;

	int len = be_str_len(n);
	int count = len / BITDHT_COMPACTNODEID_LEN;
	for (int i = 0; i < count; i++) {
		bdId id;
		if (decodeCompactNodeId(&id, &(n->val.s[i*BITDHT_COMPACTNODEID_LEN]), BITDHT_COMPACTNODEID_LEN))
			nodes.push_back(id);
	}
    return 1;
}